

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O2

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
               (cmGeneratorTarget *target,ostream *os,ImportPropertyMap *properties,
               GenerateType type,string *config)

{
  _Rb_tree_node_base *__lhs;
  cmMakefile *this;
  pointer pcVar1;
  cmGeneratorTarget *this_00;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  TargetType TVar6;
  ostream *poVar7;
  string *psVar8;
  cmLinkInterfaceLibraries *pcVar9;
  _Base_ptr p_Var10;
  cmLinkImplementation *pcVar11;
  pointer this_01;
  char *pcVar12;
  string *i;
  _Alloc_hider _Var13;
  string_view arg;
  string_view arg_00;
  string_view separator;
  string_view str;
  string_view str_00;
  string sharedLibs;
  string ldlibs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream w;
  size_t local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
  if ((PVar5 == WARN) || (PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0022(target), PVar5 == OLD))
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    pcVar12 = "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    if (type == BUILD) {
      pcVar12 = "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    }
    std::operator<<((ostream *)&w,pcVar12);
    poVar7 = std::operator<<((ostream *)&w," set to OLD for target ");
    psVar8 = cmTarget::GetName_abi_cxx11_(target->Target);
    poVar7 = std::operator<<(poVar7,(string *)psVar8);
    poVar7 = std::operator<<(poVar7,". ");
    std::operator<<(poVar7,"The export will only work with CMP0022 set to NEW.");
    this = target->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this,AUTHOR_WARNING,&sharedLibs);
    std::__cxx11::string::~string((string *)&sharedLibs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
  }
  if ((properties->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator<<(os,"LOCAL_CPP_FEATURES := rtti exceptions\n");
    for (p_Var10 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &(properties->_M_t)._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      __lhs = p_Var10 + 1;
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"INTERFACE_COMPILE_OPTIONS");
      if (bVar3) {
        std::operator<<(os,"LOCAL_CPP_FEATURES += ");
        poVar7 = os;
LAB_00395df6:
        poVar7 = std::operator<<(poVar7,(string *)(p_Var10 + 2));
        std::operator<<(poVar7,"\n");
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"INTERFACE_LINK_LIBRARIES");
        if (bVar3) {
          _w = (pointer)local_198;
          local_1a0 = 0;
          sharedLibs._M_dataplus._M_p = (pointer)&sharedLibs.field_2;
          sharedLibs._M_string_length = 0;
          local_198[0]._M_local_buf[0] = '\0';
          sharedLibs.field_2._M_local_buf[0] = '\0';
          ldlibs._M_dataplus._M_p = (pointer)&ldlibs.field_2;
          ldlibs._M_string_length = 0;
          ldlibs.field_2._M_local_buf[0] = '\0';
          pcVar9 = cmGeneratorTarget::GetLinkInterfaceLibraries(target,config,target,Link);
          pcVar1 = (pcVar9->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (this_01 = (pcVar9->Libraries).
                         super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                         super__Vector_impl_data._M_start; this_01 != pcVar1; this_01 = this_01 + 1)
          {
            this_00 = this_01->Target;
            psVar8 = cmLinkItem::AsStr_abi_cxx11_(this_01);
            if (this_00 == (cmGeneratorTarget *)0x0) {
              if (type == INSTALL) {
                str._M_str = (psVar8->_M_dataplus)._M_p;
                str._M_len = psVar8->_M_string_length;
                bVar3 = cmHasLiteralPrefix<4ul>(str,(char (*) [4])0x5ffd3d);
              }
              else {
                bVar3 = false;
              }
              bVar4 = cmsys::SystemTools::FileIsFullPath(psVar8);
              if ((bVar4) ||
                 (str_00._M_str = (psVar8->_M_dataplus)._M_p,
                 str_00._M_len = psVar8->_M_string_length,
                 bVar4 = cmHasLiteralPrefix<3ul>(str_00,(char (*) [3])0x648e6d),
                 (bVar3 | bVar4) == 1)) {
                std::operator+(&local_1c8," ",psVar8);
                std::__cxx11::string::append((string *)&ldlibs);
                goto LAB_00395fa1;
              }
              if (psVar8->_M_string_length != 0) {
                std::operator+(&local_1c8," -l",psVar8);
                std::__cxx11::string::append((string *)&ldlibs);
                goto LAB_00395fa1;
              }
            }
            else {
              TVar6 = cmGeneratorTarget::GetType(this_00);
              if ((TVar6 == SHARED_LIBRARY) ||
                 (TVar6 = cmGeneratorTarget::GetType(this_00), TVar6 == MODULE_LIBRARY)) {
                std::operator+(&local_1c8," ",psVar8);
                std::__cxx11::string::append((string *)&sharedLibs);
              }
              else {
                std::operator+(&local_1c8," ",psVar8);
                std::__cxx11::string::append((string *)&w);
              }
LAB_00395fa1:
              std::__cxx11::string::~string((string *)&local_1c8);
            }
          }
          if (sharedLibs._M_string_length != 0) {
            poVar7 = std::operator<<(os,"LOCAL_SHARED_LIBRARIES :=");
            poVar7 = std::operator<<(poVar7,(string *)&sharedLibs);
            std::operator<<(poVar7,"\n");
          }
          if (ldlibs._M_string_length != 0) {
            poVar7 = std::operator<<(os,"LOCAL_EXPORT_LDLIBS :=");
            poVar7 = std::operator<<(poVar7,(string *)&ldlibs);
            std::operator<<(poVar7,"\n");
          }
          std::__cxx11::string::~string((string *)&ldlibs);
          std::__cxx11::string::~string((string *)&sharedLibs);
          std::__cxx11::string::~string((string *)&w);
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"INTERFACE_INCLUDE_DIRECTORIES");
          if (bVar3) {
            std::__cxx11::string::string((string *)&w,(string *)(p_Var10 + 2));
            arg._M_str = _w;
            arg._M_len = local_1a0;
            cmExpandedList_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&ldlibs,arg,false);
            std::operator<<(os,"LOCAL_EXPORT_C_INCLUDES := ");
            sVar2 = ldlibs._M_string_length;
            sharedLibs._M_dataplus._M_p = (pointer)&sharedLibs.field_2;
            sharedLibs._M_string_length = 0;
            sharedLibs.field_2._M_local_buf[0] = '\0';
            for (_Var13 = ldlibs._M_dataplus; _Var13._M_p != (pointer)sVar2;
                _Var13._M_p = _Var13._M_p + 0x20) {
              poVar7 = std::operator<<(os,(string *)&sharedLibs);
              std::operator<<(poVar7,(string *)_Var13._M_p);
              std::__cxx11::string::assign((char *)&sharedLibs);
            }
            std::operator<<(os,"\n");
            std::__cxx11::string::~string((string *)&sharedLibs);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&ldlibs);
            std::__cxx11::string::~string((string *)&w);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"INTERFACE_LINK_OPTIONS");
            if (!bVar3) {
              poVar7 = std::operator<<(os,"# ");
              poVar7 = std::operator<<(poVar7,(string *)__lhs);
              poVar7 = std::operator<<(poVar7," ");
              goto LAB_00395df6;
            }
            std::operator<<(os,"LOCAL_EXPORT_LDFLAGS := ");
            arg_00._M_str = *(char **)(p_Var10 + 2);
            arg_00._M_len = (size_t)p_Var10[2]._M_parent;
            cmExpandedList_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&sharedLibs,arg_00,false);
            separator._M_str = " ";
            separator._M_len = 1;
            cmJoin((string *)&w,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&sharedLibs,separator,(string_view)ZEXT816(0));
            poVar7 = std::operator<<(os,(string *)&w);
            std::operator<<(poVar7,"\n");
            std::__cxx11::string::~string((string *)&w);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&sharedLibs);
          }
        }
      }
    }
  }
  TVar6 = cmGeneratorTarget::GetType(target);
  if (TVar6 == STATIC_LIBRARY) {
    pcVar11 = cmGeneratorTarget::GetLinkImplementation(target,config,Link);
    bVar3 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[4],_0>
                      (&pcVar11->Languages,(char (*) [4])0x618f44);
    if (bVar3) {
      std::operator<<(os,"LOCAL_HAS_CPP := true\n");
    }
  }
  TVar6 = cmGeneratorTarget::GetType(target);
  if (TVar6 - STATIC_LIBRARY < 3) {
    std::operator<<(os,&DAT_00648f8c + *(int *)(&DAT_00648f8c + (ulong)(TVar6 - STATIC_LIBRARY) * 4)
                   );
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (auto const& property : properties) {
      if (property.first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (property.second) << "\n";
      } else if (property.first == "INTERFACE_LINK_LIBRARIES") {
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        cmLinkInterfaceLibraries const* linkIFace =
          target->GetLinkInterfaceLibraries(
            config, target, cmGeneratorTarget::LinkInterfaceFor::Link);
        for (cmLinkItem const& item : linkIFace->Libraries) {
          cmGeneratorTarget const* gt = item.Target;
          std::string const& lib = item.AsStr();
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + lib;
            } else {
              staticLibs += " " + lib;
            }
          } else {
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = cmHasLiteralPrefix(lib, "../");
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(lib) ||
                cmHasLiteralPrefix(lib, "-l") || relpath) {
              ldlibs += " " + lib;
              // if it is not a path and does not have a -l then add -l
            } else if (!lib.empty()) {
              ldlibs += " -l" + lib;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (property.first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = property.second;
        std::vector<std::string> includeList = cmExpandedList(includes);
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::string const& i : includeList) {
          os << end << i;
          end = "\\\n";
        }
        os << "\n";
      } else if (property.first == "INTERFACE_LINK_OPTIONS") {
        os << "LOCAL_EXPORT_LDFLAGS := ";
        std::vector<std::string> linkFlagsList =
          cmExpandedList(property.second);
        os << cmJoin(linkFlagsList, " ") << "\n";
      } else {
        os << "# " << property.first << " " << (property.second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(
      config, cmGeneratorTarget::LinkInterfaceFor::Link);
    if (cm::contains(li->Languages, "CXX")) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}